

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockReturnValueTest.cpp
# Opt level: O1

void __thiscall
TEST_MockReturnValueTest_PositiveIntReturnValueCanBeRetrievedAsUnsignedInt_Test::testBody
          (TEST_MockReturnValueTest_PositiveIntReturnValueCanBeRetrievedAsUnsignedInt_Test *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  undefined4 extraout_var_00;
  TestTerminator *pTVar5;
  SimpleString local_88;
  SimpleString local_78;
  MockNamedValue local_68;
  
  SimpleString::SimpleString((SimpleString *)&local_68,"");
  pMVar3 = mock((SimpleString *)&local_68,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_88,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_88);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 200))((long *)CONCAT44(extraout_var,iVar1),7)
  ;
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString((SimpleString *)&local_68);
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_88,"");
  pMVar3 = mock(&local_88,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_78,"foo");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_78);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0xa8))
            (&local_68,(long *)CONCAT44(extraout_var_00,iVar1));
  uVar2 = MockNamedValue::getUnsignedIntValue(&local_68);
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[0xe])
            (pUVar4,7,(ulong)uVar2,
             "LONGS_EQUAL(expected_value, mock().actualCall(\"foo\").returnValue().getUnsignedIntValue()) failed"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockReturnValueTest.cpp"
             ,0x47,pTVar5);
  MockNamedValue::~MockNamedValue(&local_68);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_88);
  return;
}

Assistant:

TEST(MockReturnValueTest, PositiveIntReturnValueCanBeRetrievedAsUnsignedInt)
{
    int expected_value = 7;
    mock().expectOneCall("foo").andReturnValue(expected_value);
    LONGS_EQUAL(expected_value, mock().actualCall("foo").returnValue().getUnsignedIntValue());
}